

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
 __thiscall
duckdb::StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
InitializeStatsState
          (StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
           *this)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x7fefffffffffffff;
  pp_Var1[2] = (_func_int *)0xffefffffffffffff;
  *pp_Var1 = (_func_int *)&PTR__ColumnWriterStatistics_024c6ee0;
  *(undefined1 *)(pp_Var1 + 3) = 0;
  (this->super_PrimitiveColumnWriter).super_ColumnWriter._vptr_ColumnWriter = pp_Var1;
  return (unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
          )(unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
            )this;
}

Assistant:

unique_ptr<ColumnWriterStatistics> InitializeStatsState() override {
		return OP::template InitializeStats<SRC, TGT>();
	}